

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
_applyScaledObj<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *solver,Rational *dualScale,SolRational *sol)

{
  pointer pnVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  uint uVar8;
  Rational newRowObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  data_type local_108;
  undefined8 local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  data_type local_e8;
  undefined8 local_d8;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  *local_c0;
  undefined8 local_b8;
  uint auStack_b0 [7];
  undefined3 uStack_93;
  int local_90;
  byte local_8c;
  undefined8 local_88;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  *local_80;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_78;
  SolRational *local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  lVar5 = (long)*(int *)(*(long *)(this + 0x52e0) + 0x100);
  local_78 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)dualScale;
  local_70 = sol;
  if (0 < lVar5) {
    local_c0 = this + 0x80;
    lVar6 = lVar5 << 6;
    do {
      lVar6 = lVar6 + -0x40;
      iVar3 = boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)(*(long *)(this + 0x59c8) + lVar6),
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)(this + 0x40));
      if (iVar3 < 0) {
        iVar3 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)(*(long *)(this + 0x59c8) + lVar6),
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)local_c0);
        if (iVar3 < 1) {
          uVar7 = (undefined4)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0);
          uVar8 = (uint)((ulong)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0) >> 0x20) ^ 0x80000000
          ;
          goto LAB_0035d090;
        }
        local_d8 = 0xa00000000;
        local_108.la[0] = 0;
        local_108.ld.data = (limb_pointer)0x0;
        local_f8 = 0;
        uStack_f0 = 0;
        uStack_eb = 0;
        local_e8.ld.capacity = 0;
        local_e8.la[0]._4_4_ = 0;
        local_e8.la[1]._0_5_ = 0;
        boost::multiprecision::detail::
        generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                  ((cpp_dec_float<50U,_int,_void> *)&local_108.ld,
                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)(*(long *)(this + 0x59c8) + lVar6));
      }
      else {
        uVar7 = (undefined4)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0);
        uVar8 = (uint)((ulong)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0) >> 0x20);
LAB_0035d090:
        local_d8 = 0xa00000000;
        local_108.la[0] = 0;
        local_108.ld.data = (limb_pointer)0x0;
        local_f8 = 0;
        uStack_f0 = 0;
        uStack_eb = 0;
        local_e8.ld.capacity = 0;
        local_e8.la[0]._4_4_ = 0;
        local_e8.la[1]._0_5_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_108.ld,(double)CONCAT44(uVar8,uVar7));
      }
      (*(solver->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x24])(solver,(ulong)((int)lVar5 - 1),&local_108);
      bVar2 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar2);
  }
  lVar5 = (long)*(int *)(*(long *)(this + 0x52e0) + 0x38);
  if (0 < lVar5) {
    local_c0 = this + 0x40;
    local_80 = this + 0x80;
    lVar6 = lVar5 << 6;
    do {
      local_108.la[0] = 0;
      local_f8 = CONCAT17(local_f8._7_1_,0x10000000001);
      local_e8.ld.capacity = 1;
      local_e8.la[0]._4_4_ = 0;
      local_d8 = CONCAT17(local_d8._7_1_,0x10000000001);
      iVar3 = (int)lVar5;
      if (*(int *)(*(long *)(this + 0x5a78) + -4 + lVar5 * 4) == 4) {
        local_88._0_4_ = cpp_dec_float_finite;
        local_88._4_4_ = 10;
        local_b8._0_4_ = 0;
        local_b8._4_4_ = 0;
        auStack_b0[0] = 0;
        auStack_b0[1] = 0;
        auStack_b0[2] = 0;
        auStack_b0[3] = 0;
        auStack_b0[4] = 0;
        auStack_b0[5] = 0;
        stack0xffffffffffffff68 = 0;
        uStack_93 = 0;
        local_90 = 0;
        local_8c = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_b8,0.0);
        (*(solver->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x3c])
                  (solver,(ulong)(iVar3 - 1),(cpp_dec_float<50u,int,void> *)&local_b8);
      }
      else {
        pnVar1 = (local_70->_dual).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_108.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&pnVar1[-1].m_backend.m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar6));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_e8.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&pnVar1[-1].m_backend.m_value.den.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar6));
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)&local_108.ld,local_78);
        iVar4 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_108.ld,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)local_c0);
        if (iVar4 < 0) {
          iVar4 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_108.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)local_80);
          if (iVar4 < 1) {
            local_88._0_4_ = cpp_dec_float_finite;
            local_88._4_4_ = 10;
            local_b8._0_4_ = 0;
            local_b8._4_4_ = 0;
            auStack_b0[0] = 0;
            auStack_b0[1] = 0;
            auStack_b0[2] = 0;
            auStack_b0[3] = 0;
            auStack_b0[4] = 0;
            auStack_b0[5] = 0;
            stack0xffffffffffffff68 = 0;
            uStack_93 = 0;
            local_90 = 0;
            local_8c = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_b8,
                       *(double *)(*(long *)(this + 0x28) + 0xc0));
            (*(solver->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x3c])
                      (solver,(ulong)(iVar3 - 1),(cpp_dec_float<50u,int,void> *)&local_b8);
          }
          else {
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems[6] = 0;
            local_68.data._M_elems[7] = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68.data._M_elems[9]._1_3_ = 0;
            local_68.exp = 0;
            local_68.neg = false;
            boost::multiprecision::detail::
            generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      (&local_68,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_108.ld);
            local_b8._0_4_ = local_68.data._M_elems[0];
            local_b8._4_4_ = local_68.data._M_elems[1];
            auStack_b0[0] = local_68.data._M_elems[2];
            auStack_b0[1] = local_68.data._M_elems[3];
            stack0xffffffffffffff68 = local_68.data._M_elems._32_5_;
            uStack_93 = local_68.data._M_elems[9]._1_3_;
            auStack_b0[2] = local_68.data._M_elems[4];
            auStack_b0[3] = local_68.data._M_elems[5];
            auStack_b0[4] = local_68.data._M_elems[6];
            auStack_b0[5] = local_68.data._M_elems[7];
            local_90 = local_68.exp;
            local_8c = local_68.neg;
            local_88._0_4_ = local_68.fpclass;
            local_88._4_4_ = local_68.prec_elem;
            if (local_68.fpclass != cpp_dec_float_finite || local_68.data._M_elems[0] != 0) {
              local_8c = local_68.neg ^ 1;
            }
            (*(solver->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x3c])(solver,(ulong)(iVar3 - 1),&local_b8);
          }
        }
        else {
          local_88._0_4_ = cpp_dec_float_finite;
          local_88._4_4_ = 10;
          local_b8._0_4_ = 0;
          local_b8._4_4_ = 0;
          auStack_b0[0] = 0;
          auStack_b0[1] = 0;
          auStack_b0[2] = 0;
          auStack_b0[3] = 0;
          auStack_b0[4] = 0;
          auStack_b0[5] = 0;
          stack0xffffffffffffff68 = 0;
          uStack_93 = 0;
          local_90 = 0;
          local_8c = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_b8,
                     -*(double *)(*(long *)(this + 0x28) + 0xc0));
          (*(solver->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x3c])
                    (solver,(ulong)(iVar3 - 1),(cpp_dec_float<50u,int,void> *)&local_b8);
        }
      }
      if ((local_d8._5_1_ == '\0') && (local_d8._6_1_ == '\0')) {
        operator_delete((void *)CONCAT35(local_e8.la[1]._5_3_,local_e8.la[1]._0_5_),
                        (ulong)local_e8.ld.capacity << 3);
      }
      if ((local_f8._5_1_ == '\0') && (local_f8._6_1_ == '\0')) {
        operator_delete(local_108.ld.data,(local_108.la[0] & 0xffffffff) << 3);
      }
      bVar2 = 1 < lVar5;
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x40;
    } while (bVar2);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_applyScaledObj(SPxSolverBase<T>& solver, Rational& dualScale, SolRational& sol)
{
   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      if(_modObj[c] >= _rationalPosInfty)
         solver.changeObj(c, realParam(SoPlexBase<R>::INFTY));
      else if(_modObj[c] <= _rationalNegInfty)
         solver.changeObj(c, -realParam(SoPlexBase<R>::INFTY));
      else
         solver.changeObj(c, T(_modObj[c]));
   }

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      Rational newRowObj;

      if(_rowTypes[r] == RANGETYPE_FIXED)
         solver.changeRowObj(r, T(0.0));
      else
      {
         newRowObj = sol._dual[r];
         newRowObj *= dualScale;

         if(newRowObj >= _rationalPosInfty)
            solver.changeRowObj(r, -realParam(SoPlexBase<R>::INFTY));
         else if(newRowObj <= _rationalNegInfty)
            solver.changeRowObj(r, realParam(SoPlexBase<R>::INFTY));
         else
            solver.changeRowObj(r, -T(newRowObj));
      }
   }
}